

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest02ValidityPeriods_::
Section2Invalidpre2000UTCEEnotAfterDateTest7<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section2Invalidpre2000UTCEEnotAfterDateTest7
          (Section2Invalidpre2000UTCEEnotAfterDateTest7<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest02ValidityPeriods,
                     Section2Invalidpre2000UTCEEnotAfterDateTest7) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "Invalidpre2000UTCEEnotAfterDateTest7EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.2.7";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}